

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

void __thiscall polyscope::SlicePlane::~SlicePlane(SlicePlane *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *pvVar3;
  Engine *this_00;
  long lVar4;
  string local_58;
  string local_38;
  
  ensureVolumeInspectValid(this);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  setVolumeMeshToInspect(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  this_00 = render::engine;
  pcVar1 = (this->postfix)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (this->postfix)._M_string_length);
  render::Engine::removeSlicePlane(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  p_Var2 = (this->planeProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  lVar4 = 0x618;
  do {
    render::ManagedBuffer<unsigned_int>::~ManagedBuffer
              ((ManagedBuffer<unsigned_int> *)((long)&(this->name)._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0xe8;
  } while (lVar4 != 0x278);
  lVar4 = 0x348;
  do {
    pvVar3 = *(void **)((long)&(this->name)._M_dataplus._M_p + lVar4);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0x2e8);
  TransformationGizmo::~TransformationGizmo(&this->transformGizmo,&TransformationGizmo::VTT);
  *(undefined ***)&(this->transformGizmo).field_0x100 = &PTR__WeakReferrable_005f6630;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->transformGizmo).field_0x110;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->volumeInspectProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pcVar1 = (this->inspectedMeshName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->inspectedMeshName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->transparency).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->transparency).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->gridLineColor).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->gridLineColor).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->color).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->color).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->objectTransform).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->objectTransform).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->drawWidget).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->drawWidget).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->drawPlane).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->drawPlane).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->active).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->active).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->postfix)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->postfix).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

SlicePlane::~SlicePlane() {
  ensureVolumeInspectValid();
  setVolumeMeshToInspect(""); // disable any slicing
  render::engine->removeSlicePlane(postfix);
}